

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O2

Classifier __thiscall CLI::App::_recognize(App *this,string *current,bool ignore_used_subcommands)

{
  bool bVar1;
  Classifier CVar2;
  Option *pOVar3;
  size_type __n;
  App *this_00;
  Classifier CVar4;
  string dummy1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string dummy2;
  string local_50;
  
  dummy1._M_dataplus._M_p = (pointer)&dummy1.field_2;
  dummy1._M_string_length = 0;
  dummy1.field_2._M_local_buf[0] = '\0';
  dummy2._M_dataplus._M_p = (pointer)&dummy2.field_2;
  dummy2._M_string_length = 0;
  dummy2.field_2._M_local_buf[0] = '\0';
  bVar1 = ::std::operator==(current,"--");
  if (bVar1) {
    CVar4 = POSITIONAL_MARK;
    goto LAB_001897ca;
  }
  bVar1 = _valid_subcommand(this,current,ignore_used_subcommands);
  CVar4 = SUBCOMMAND;
  if (bVar1) goto LAB_001897ca;
  bVar1 = CLI::detail::split_long(current,&dummy1,&dummy2);
  if (bVar1) {
    CVar4 = LONG;
    goto LAB_001897ca;
  }
  bVar1 = CLI::detail::split_short(current,&dummy1,&dummy2);
  if (bVar1) {
    if ((byte)(*dummy1._M_dataplus._M_p - 0x30U) < 10) {
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      local_50.field_2._M_allocated_capacity._0_2_ =
           (ushort)(byte)*dummy1._M_dataplus._M_p << 8 | 0x2d;
      local_50._M_string_length = 2;
      local_50.field_2._M_local_buf[2] = '\0';
      pOVar3 = get_option_no_throw(this,&local_50);
      ::std::__cxx11::string::~string((string *)&local_50);
      if (pOVar3 == (Option *)0x0) goto LAB_00189957;
    }
    CVar4 = SHORT;
  }
  else {
    if ((this->allow_windows_style_options_ == true) &&
       (bVar1 = CLI::detail::split_windows_style(current,&dummy1,&dummy2), bVar1)) {
      CVar4 = WINDOWS_STYLE;
      goto LAB_001897ca;
    }
    bVar1 = ::std::operator==(current,"++");
    if (((bVar1) && ((this->name_)._M_string_length != 0)) && (this->parent_ != (App *)0x0)) {
      CVar4 = SUBCOMMAND_TERMINATOR;
      goto LAB_001897ca;
    }
    __n = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                    (current,'.',0);
    if (__n != 0xffffffffffffffff) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                (&local_90,current,0,__n);
      this_00 = _find_subcommand(this,&local_90,true,ignore_used_subcommands);
      ::std::__cxx11::string::~string((string *)&local_90);
      if (this_00 != (App *)0x0) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  (&local_90,current,__n + 1,0xffffffffffffffff);
        CVar2 = _recognize(this_00,&local_90,ignore_used_subcommands);
        ::std::__cxx11::string::~string((string *)&local_90);
        if (CVar2 == SUBCOMMAND) goto LAB_001897ca;
      }
    }
LAB_00189957:
    CVar4 = NONE;
  }
LAB_001897ca:
  ::std::__cxx11::string::~string((string *)&dummy2);
  ::std::__cxx11::string::~string((string *)&dummy1);
  return CVar4;
}

Assistant:

CLI11_NODISCARD CLI11_INLINE detail::Classifier App::_recognize(const std::string &current,
                                                                bool ignore_used_subcommands) const {
    std::string dummy1, dummy2;

    if(current == "--")
        return detail::Classifier::POSITIONAL_MARK;
    if(_valid_subcommand(current, ignore_used_subcommands))
        return detail::Classifier::SUBCOMMAND;
    if(detail::split_long(current, dummy1, dummy2))
        return detail::Classifier::LONG;
    if(detail::split_short(current, dummy1, dummy2)) {
        if(dummy1[0] >= '0' && dummy1[0] <= '9') {
            if(get_option_no_throw(std::string{'-', dummy1[0]}) == nullptr) {
                return detail::Classifier::NONE;
            }
        }
        return detail::Classifier::SHORT;
    }
    if((allow_windows_style_options_) && (detail::split_windows_style(current, dummy1, dummy2)))
        return detail::Classifier::WINDOWS_STYLE;
    if((current == "++") && !name_.empty() && parent_ != nullptr)
        return detail::Classifier::SUBCOMMAND_TERMINATOR;
    auto dotloc = current.find_first_of('.');
    if(dotloc != std::string::npos) {
        auto *cm = _find_subcommand(current.substr(0, dotloc), true, ignore_used_subcommands);
        if(cm != nullptr) {
            auto res = cm->_recognize(current.substr(dotloc + 1), ignore_used_subcommands);
            if(res == detail::Classifier::SUBCOMMAND) {
                return res;
            }
        }
    }
    return detail::Classifier::NONE;
}